

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O3

void __thiscall PropertyParser::parseLinkProperty(PropertyParser *this,int type,string *linkName)

{
  pointer pcVar1;
  InputError *this_00;
  int iVar2;
  undefined4 extraout_var;
  int type_00;
  string local_48;
  
  iVar2 = Network::link((this->super_InputParser).network,(char *)linkName,(char *)linkName);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    switch(type) {
    case 0:
      LinkParser::parseStatus
                ((LinkParser *)&this->field_0x11,(Link *)CONCAT44(extraout_var,iVar2),&this->tokens)
      ;
      return;
    case 1:
      LinkParser::parseLeakage
                ((LinkParser *)&this->field_0x11,(Link *)CONCAT44(extraout_var,iVar2),&this->tokens)
      ;
      return;
    case 2:
      LinkParser::parseEnergy
                ((LinkParser *)&this->field_0x11,(Link *)CONCAT44(extraout_var,iVar2),
                 (this->super_InputParser).network,&this->tokens);
      return;
    case 3:
      type_00 = 0;
      break;
    case 4:
      type_00 = 1;
      break;
    default:
      return;
    }
    LinkParser::parseReaction
              ((LinkParser *)&this->field_0x11,(Link *)CONCAT44(extraout_var,iVar2),type_00,
               &this->tokens);
    return;
  }
  this_00 = (InputError *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (linkName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + linkName->_M_string_length);
  InputError::InputError(this_00,5,&local_48);
  __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void PropertyParser::parseLinkProperty(int type, string& linkName)
{
    Link* link = network->link(linkName);
    if ( link == nullptr ) throw InputError(InputError::UNDEFINED_OBJECT, linkName);
    switch (type)
    {
        case STATUS:  linkParser.parseStatus(link, tokens);               break;
        case LEAKAGE: linkParser.parseLeakage(link, tokens);              break;
        case ENERGY:  linkParser.parseEnergy(link, network, tokens);      break;
        case BULK:    linkParser.parseReaction(link, Link::BULK, tokens); break;
        case WALL:    linkParser.parseReaction(link, Link::WALL, tokens); break;
    }
}